

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

StringRef * Potassco::operator<<(StringRef *str,uchar *val)

{
  ulong uVar1;
  
  uVar1 = str->out->_M_string_length;
  if (uVar1 != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)str->out,uVar1,0,'\x01');
  }
  xconvert(str->out,(uint)*val);
  return str;
}

Assistant:

inline StringRef& operator<<(StringRef& str, const T& val) {
	if (!str.out->empty()) { str.out->append(1, ','); }
	xconvert(*str.out, val);
	return str;
}